

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageRotateCCW(Image *image)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar3 = GetPixelDataSize(1,1,image->format);
    uVar1 = image->width;
    lVar12 = (long)image->height;
    pvVar4 = malloc((long)(int)(image->height * uVar1 * uVar3));
    if (0 < lVar12) {
      iVar5 = (uVar1 - 1) * uVar3;
      lVar6 = 0;
      pvVar7 = pvVar4;
      do {
        if (0 < (int)uVar1) {
          uVar11 = 0;
          pvVar9 = pvVar7;
          iVar8 = iVar5;
          do {
            if (0 < (int)uVar3) {
              pvVar2 = image->data;
              uVar10 = 0;
              do {
                *(undefined1 *)((long)pvVar9 + uVar10) =
                     *(undefined1 *)((long)pvVar2 + uVar10 + (long)iVar8);
                uVar10 = uVar10 + 1;
              } while (uVar3 != uVar10);
            }
            uVar11 = uVar11 + 1;
            pvVar9 = (void *)((long)pvVar9 + (int)uVar3 * lVar12);
            iVar8 = iVar8 - uVar3;
          } while (uVar11 != uVar1);
        }
        lVar6 = lVar6 + 1;
        pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar3);
        iVar5 = iVar5 + uVar3 * uVar1;
      } while (lVar6 != lVar12);
    }
    free(image->data);
    image->data = pvVar4;
    lVar12._0_4_ = image->width;
    lVar12._4_4_ = image->height;
    uVar11._0_4_ = image->width;
    uVar11._4_4_ = image->height;
    uVar11 = lVar12 << 0x20 | uVar11 >> 0x20;
    image->width = (int)uVar11;
    image->height = (int)(uVar11 >> 0x20);
  }
  return;
}

Assistant:

void ImageRotateCCW(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                //memcpy(rotatedData + (x*image->height + y))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - x - 1))*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) rotatedData[(x*image->height + y)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - x - 1))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        int width = image->width;
        int height = image-> height;

        image->width = height;
        image->height = width;
    }
}